

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::verifyTextureGatherResult
          (TextureBorderClampTest *this,ConstPixelBufferAccess *renderedFrame,float *texCoordArray,
          ReferenceParams *samplerParams,LookupPrecision *lookupPrecision)

{
  deUint8 mask;
  bool bVar1;
  int iVar2;
  int iVar3;
  RenderTarget *this_00;
  PixelFormat *pPVar4;
  Texture2D *this_01;
  Texture2D *this_02;
  IVec2 (*offsets) [4];
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  float fVar7;
  float fVar8;
  Texture2DView TVar9;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  LogImage local_648;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  LogImage local_568;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  LogImage local_488;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  LogImageSet local_3a8;
  MessageBuilder local_368;
  deUint32 local_1e4;
  Vector<float,_4> local_1e0;
  Vector<bool,_4> local_1d0;
  Vector<bool,_4> local_1cc;
  deUint32 local_1c8;
  Vector<float,_4> local_1c4;
  undefined1 local_1b4 [8];
  Vec4 resultValue;
  Vec4 resultPixel;
  undefined1 local_184 [8];
  Vec4 referencePixel;
  Vec4 referenceValue;
  Vec2 texCoord;
  Vector<float,_2> local_154;
  Vector<float,_2> local_14c;
  Vector<float,_2> local_144;
  Vector<float,_2> local_13c;
  Vec2 viewportCoord;
  int px;
  int py;
  PixelBufferAccess local_118;
  int local_ec;
  undefined1 local_e8 [4];
  int numFailedPixels;
  Surface errorMask;
  Surface reference;
  Texture2DView local_a8;
  undefined1 local_98 [8];
  Texture2DView effectiveView;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  undefined1 auStack_68 [7];
  deUint8 fbColormask;
  PixelFormat pixelFormat;
  Vec2 texCoords [4];
  LookupPrecision *lookupPrecision_local;
  ReferenceParams *samplerParams_local;
  float *texCoordArray_local;
  ConstPixelBufferAccess *renderedFrame_local;
  TextureBorderClampTest *this_local;
  
  tcu::Vector<float,_2>::Vector
            ((Vector<float,_2> *)&pixelFormat.blueBits,*texCoordArray,texCoordArray[1]);
  tcu::Vector<float,_2>::Vector(texCoords,texCoordArray[2],texCoordArray[3]);
  tcu::Vector<float,_2>::Vector(texCoords + 1,texCoordArray[4],texCoordArray[5]);
  tcu::Vector<float,_2>::Vector(texCoords + 2,texCoordArray[6],texCoordArray[7]);
  this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar4 = tcu::RenderTarget::getPixelFormat(this_00);
  auStack_68._0_4_ = pPVar4->redBits;
  unique0x10000822 = pPVar4->greenBits;
  pixelFormat.redBits = pPVar4->blueBits;
  pixelFormat.greenBits = pPVar4->alphaBits;
  mask = tcu::getColorMask((PixelFormat *)auStack_68);
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &effectiveView.m_levels);
  this_01 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::operator->
                      (&(this->m_texture).
                        super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
  this_02 = glu::Texture2D::getRefTexture(this_01);
  TVar9 = tcu::Texture2D::operator_cast_to_Texture2DView(this_02);
  local_a8.m_levels = TVar9.m_levels;
  local_a8.m_numLevels = TVar9.m_numLevels;
  TVar9 = tcu::getEffectiveTextureView
                    (&local_a8,
                     (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      *)&effectiveView.m_levels,&samplerParams->sampler);
  effectiveView._0_8_ = TVar9.m_levels;
  local_98._0_4_ = TVar9.m_numLevels;
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(renderedFrame);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(renderedFrame);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,iVar2,iVar3);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(renderedFrame);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(renderedFrame);
  tcu::Surface::Surface((Surface *)local_e8,iVar2,iVar3);
  local_ec = 0;
  tcu::Surface::getAccess(&local_118,(Surface *)local_e8);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(&local_118,(Vec4 *)&py);
  for (viewportCoord.m_data[1] = 0.0; fVar7 = viewportCoord.m_data[1],
      iVar2 = tcu::Surface::getHeight((Surface *)&errorMask.m_pixels.m_cap), (int)fVar7 < iVar2;
      viewportCoord.m_data[1] = (float)((int)viewportCoord.m_data[1] + 1)) {
    for (viewportCoord.m_data[0] = 0.0; fVar7 = viewportCoord.m_data[0],
        iVar2 = tcu::Surface::getWidth((Surface *)&errorMask.m_pixels.m_cap), (int)fVar7 < iVar2;
        viewportCoord.m_data[0] = (float)((int)viewportCoord.m_data[0] + 1)) {
      tcu::Vector<float,_2>::Vector
                (&local_14c,(float)(int)viewportCoord.m_data[0],(float)(int)viewportCoord.m_data[1])
      ;
      tcu::Vector<float,_2>::Vector(&local_154,0.5);
      tcu::operator+((tcu *)&local_144,&local_14c,&local_154);
      iVar2 = tcu::Surface::getWidth((Surface *)&errorMask.m_pixels.m_cap);
      iVar3 = tcu::Surface::getHeight((Surface *)&errorMask.m_pixels.m_cap);
      tcu::Vector<float,_2>::Vector(&texCoord,(float)iVar2,(float)iVar3);
      tcu::operator/((tcu *)&local_13c,&local_144,&texCoord);
      fVar7 = tcu::Vector<float,_2>::x(&local_13c);
      fVar8 = tcu::Vector<float,_2>::y(&local_13c);
      (anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
                ((_anonymous_namespace_ *)(referenceValue.m_data + 2),
                 (Vector<float,_2> (*) [4])&pixelFormat.blueBits,fVar7,fVar8);
      fVar7 = tcu::Vector<float,_2>::x((Vector<float,_2> *)(referenceValue.m_data + 2));
      fVar8 = tcu::Vector<float,_2>::y((Vector<float,_2> *)(referenceValue.m_data + 2));
      glu::getDefaultGatherOffsets();
      tcu::Texture2DView::gatherOffsets
                ((Texture2DView *)(referencePixel.m_data + 2),(Sampler *)local_98,fVar7,fVar8,
                 (int)samplerParams + 0x44,(IVec2 (*) [4])0x0);
      tcu::operator*((tcu *)(resultPixel.m_data + 2),(Vector<float,_4> *)(referencePixel.m_data + 2)
                     ,&(samplerParams->super_RenderParams).colorScale);
      tcu::operator+((tcu *)local_184,(Vector<float,_4> *)(resultPixel.m_data + 2),
                     &(samplerParams->super_RenderParams).colorBias);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(resultValue.m_data + 2),(int)renderedFrame,
                 (int)viewportCoord.m_data[0],(int)viewportCoord.m_data[1]);
      tcu::operator-((tcu *)&local_1c4,(Vector<float,_4> *)(resultValue.m_data + 2),
                     &(samplerParams->super_RenderParams).colorBias);
      tcu::operator/((tcu *)local_1b4,&local_1c4,&(samplerParams->super_RenderParams).colorScale);
      fVar8 = viewportCoord.m_data[1];
      fVar7 = viewportCoord.m_data[0];
      local_1c8 = (deUint32)tcu::toRGBAMasked((Vec4 *)(referencePixel.m_data + 2),mask);
      tcu::Surface::setPixel
                ((Surface *)&errorMask.m_pixels.m_cap,(int)fVar7,(int)fVar8,(RGBA)local_1c8);
      tcu::absDiff<float,4>
                ((tcu *)&local_1e0,(Vector<float,_4> *)(resultValue.m_data + 2),
                 (Vector<float,_4> *)local_184);
      tcu::greaterThan<float,4>((tcu *)&local_1d0,&local_1e0,&lookupPrecision->colorThreshold);
      tcu::logicalAnd<bool,4>((tcu *)&local_1cc,&lookupPrecision->colorMask,&local_1d0);
      bVar1 = tcu::boolAny<4>(&local_1cc);
      if (bVar1) {
        offsets = glu::getDefaultGatherOffsets();
        bVar1 = tcu::isGatherOffsetsResultValid
                          ((Texture2DView *)local_98,&samplerParams->sampler,lookupPrecision,
                           (Vec2 *)(referenceValue.m_data + 2),0,offsets,(Vec4 *)local_1b4);
        fVar8 = viewportCoord.m_data[1];
        fVar7 = viewportCoord.m_data[0];
        if (!bVar1) {
          local_1e4 = (deUint32)tcu::RGBA::red();
          tcu::Surface::setPixel((Surface *)local_e8,(int)fVar7,(int)fVar8,(RGBA)local_1e4);
          local_ec = local_ec + 1;
        }
      }
    }
  }
  if (0 < local_ec) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_368,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_368,(char (*) [40])"ERROR: Result verification failed, got ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_ec);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_368);
  }
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"VerifyResult",&local_3c9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Verification result",&local_3f1);
  tcu::LogImageSet::LogImageSet(&local_3a8,&local_3c8,&local_3f0);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"Rendered",&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"Rendered image",&local_4d1);
  tcu::LogImage::LogImage
            (&local_488,&local_4a8,&local_4d0,renderedFrame,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar5,&local_488);
  tcu::LogImage::~LogImage(&local_488);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  tcu::LogImageSet::~LogImageSet(&local_3a8);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  if (0 < local_ec) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"Reference",&local_589);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b0,"Ideal reference image",&local_5b1);
    tcu::LogImage::LogImage
              (&local_568,&local_588,&local_5b0,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_568);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"ErrorMask",&local_669);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"Error mask",&local_691)
    ;
    tcu::LogImage::LogImage
              (&local_648,&local_668,&local_690,(Surface *)local_e8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar5,&local_648);
    tcu::LogImage::~LogImage(&local_648);
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator(&local_691);
    std::__cxx11::string::~string((string *)&local_668);
    std::allocator<char>::~allocator(&local_669);
    tcu::LogImage::~LogImage(&local_568);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::allocator<char>::~allocator(&local_5b1);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator(&local_589);
  }
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(pTVar5,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  bVar1 = local_ec == 0;
  tcu::Surface::~Surface((Surface *)local_e8);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &effectiveView.m_levels);
  return bVar1;
}

Assistant:

bool TextureBorderClampTest::verifyTextureGatherResult (const tcu::ConstPixelBufferAccess&				renderedFrame,
														const float*									texCoordArray,
														const glu::TextureTestUtil::ReferenceParams&	samplerParams,
														const tcu::LookupPrecision&						lookupPrecision)
{
	const tcu::Vec2 texCoords[4] =
	{
		tcu::Vec2(texCoordArray[0], texCoordArray[1]),
		tcu::Vec2(texCoordArray[2], texCoordArray[3]),
		tcu::Vec2(texCoordArray[4], texCoordArray[5]),
		tcu::Vec2(texCoordArray[6], texCoordArray[7]),
	};

	const tcu::PixelFormat						pixelFormat			= m_context.getRenderTarget().getPixelFormat();
	const deUint8								fbColormask			= tcu::getColorMask(pixelFormat);

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture2DView					effectiveView		= tcu::getEffectiveTextureView(m_texture->getRefTexture(), srcLevelStorage, samplerParams.sampler);

	tcu::Surface								reference			(renderedFrame.getWidth(), renderedFrame.getHeight());
	tcu::Surface								errorMask			(renderedFrame.getWidth(), renderedFrame.getHeight());
	int											numFailedPixels		= 0;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());

	for (int py = 0; py < reference.getHeight(); ++py)
	for (int px = 0; px < reference.getWidth(); ++px)
	{
		const tcu::Vec2			viewportCoord	= (tcu::Vec2((float)px, (float)py) + tcu::Vec2(0.5f)) / tcu::Vec2((float)reference.getWidth(), (float)reference.getHeight());
		const tcu::Vec2			texCoord		= triQuadInterpolate(texCoords, viewportCoord.x(), viewportCoord.y());
		const tcu::Vec4			referenceValue	= effectiveView.gatherOffsets(samplerParams.sampler, texCoord.x(), texCoord.y(), 0, glu::getDefaultGatherOffsets());
		const tcu::Vec4			referencePixel	= referenceValue * samplerParams.colorScale + samplerParams.colorBias;
		const tcu::Vec4			resultPixel		= renderedFrame.getPixel(px, py);
		const tcu::Vec4			resultValue		= (resultPixel - samplerParams.colorBias) / samplerParams.colorScale;

		reference.setPixel(px, py, tcu::toRGBAMasked(referenceValue, fbColormask));

		if (tcu::boolAny(tcu::logicalAnd(lookupPrecision.colorMask,
										 tcu::greaterThan(tcu::absDiff(resultPixel, referencePixel),
														  lookupPrecision.colorThreshold))))
		{
			if (!tcu::isGatherOffsetsResultValid(effectiveView, samplerParams.sampler, lookupPrecision, texCoord, 0, glu::getDefaultGatherOffsets(), resultValue))
			{
				errorMask.setPixel(px, py, tcu::RGBA::red());
				++numFailedPixels;
			}
		}
	}

	if (numFailedPixels > 0)
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << tcu::TestLog::EndMessage;
	m_testCtx.getLog()	<< tcu::TestLog::ImageSet("VerifyResult", "Verification result")
						<< tcu::TestLog::Image("Rendered", "Rendered image", renderedFrame);
	if (numFailedPixels > 0)
	{
		m_testCtx.getLog()	<< tcu::TestLog::Image("Reference", "Ideal reference image", reference)
							<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);
	}
	m_testCtx.getLog() << tcu::TestLog::EndImageSet;

	return (numFailedPixels == 0);
}